

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

void __thiscall llvm::Triple::getWatchOSVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  OSType OVar1;
  
  OVar1 = this->OS;
  if ((int)OVar1 < 0xb) {
    if (OVar1 != Darwin) {
      if (OVar1 == IOS) {
        llvm_unreachable_internal
                  ("conflicting triple info",
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                   ,0x459);
      }
      goto LAB_0016a137;
    }
  }
  else if (OVar1 != MacOSX) {
    if (OVar1 == WatchOS) {
      getOSVersion(this,Major,Minor,Micro);
      if (*Major != 0) {
        return;
      }
      *Major = 2;
      return;
    }
LAB_0016a137:
    llvm_unreachable_internal
              ("unexpected OS for Darwin triple",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x448);
  }
  *Major = 2;
  *Minor = 0;
  *Micro = 0;
  return;
}

Assistant:

void Triple::getWatchOSVersion(unsigned &Major, unsigned &Minor,
                               unsigned &Micro) const {
  switch (getOS()) {
  default: llvm_unreachable("unexpected OS for Darwin triple");
  case Darwin:
  case MacOSX:
    // Ignore the version from the triple.  This is only handled because the
    // the clang driver combines OS X and IOS support into a common Darwin
    // toolchain that wants to know the iOS version number even when targeting
    // OS X.
    Major = 2;
    Minor = 0;
    Micro = 0;
    break;
  case WatchOS:
    getOSVersion(Major, Minor, Micro);
    if (Major == 0)
      Major = 2;
    break;
  case IOS:
    llvm_unreachable("conflicting triple info");
  }
}